

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall HEkkDual::updatePivots(HEkkDual *this)

{
  HighsInt *pHVar1;
  HEkk *this_00;
  
  if (this->rebuild_reason != 0) {
    return;
  }
  HEkk::transformForUpdate
            (this->ekk_instance_,&this->col_aq,&this->row_ep,this->variable_in,&this->row_out);
  HEkk::updatePivots(this->ekk_instance_,this->variable_in,this->row_out,this->move_out);
  this_00 = this->ekk_instance_;
  pHVar1 = &this_00->iteration_count_;
  *pHVar1 = *pHVar1 + 1;
  HEkk::updateFactor(this_00,&this->col_aq,&this->row_ep,&this->row_out,&this->rebuild_reason);
  HEkk::updateMatrix(this->ekk_instance_,this->variable_in,this->variable_out);
  HEkkDualRow::deleteFreelist(&this->dualRow,this->variable_in);
  HEkkDualRHS::updatePivots
            (&this->dualRHS,this->row_out,
             (this->ekk_instance_->info_).workValue_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[this->variable_in] + this->theta_primal);
  return;
}

Assistant:

void HEkkDual::updatePivots() {
  // UPDATE
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  // Transform the vectors used in updateFactor if the simplex NLA involves
  // scaling
  ekk_instance_.transformForUpdate(&col_aq, &row_ep, variable_in, &row_out);
  //
  // Update the sets of indices of basic and nonbasic variables
  //
  // debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "Before
  // update_pivots");
  ekk_instance_.updatePivots(variable_in, row_out, move_out);
  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "After
  //  update_pivots");
  //
  ekk_instance_.iteration_count_++;
  //
  // Update the invertible representation of the basis matrix
  ekk_instance_.updateFactor(&col_aq, &row_ep, &row_out, &rebuild_reason);
  //
  // Update the row-wise representation of the nonbasic columns
  ekk_instance_.updateMatrix(variable_in, variable_out);
  //
  // Delete Freelist entry for variable_in
  dualRow.deleteFreelist(variable_in);
  //
  // Update the primal value for the row where the basis change has
  // occurred, and set the corresponding primal infeasibility value in
  // dualRHS.work_infeasibility
  dualRHS.updatePivots(
      row_out, ekk_instance_.info_.workValue_[variable_in] + theta_primal);

  /*
  // Determine whether to reinvert based on the synthetic clock
  bool reinvert_syntheticClock = total_synthetic_tick >= build_synthetic_tick;
  const bool performed_min_updates =
      ekk_instance_.info_.update_count >=
      kSyntheticTickReinversionMinUpdateCount;
  if (reinvert_syntheticClock && performed_min_updates)
    rebuild_reason = kRebuildReasonSyntheticClockSaysInvert;
  */
}